

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

Segment * randomReflection(Segment *__return_storage_ptr__,Segment *segment,Triangle *triangle)

{
  Point *b;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Point PVar11;
  float local_78;
  float fStack_74;
  
  b = &segment->b;
  PVar11 = operator-(segment->a,b);
  fVar1 = (triangle->normal).x;
  fVar2 = (triangle->normal).y;
  fVar3 = (triangle->normal).z;
  fVar8 = randFloat(0.0,6.2831855);
  fVar9 = randFloat(-1.0,1.0);
  dVar6 = 1.0 - (double)(fVar9 * fVar9);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar7 = sin((double)fVar8);
  fVar10 = (float)(dVar7 * (double)(float)dVar6);
  dVar7 = cos((double)fVar8);
  fVar8 = (float)(dVar7 * (double)(float)dVar6);
  local_78 = PVar11.x;
  fStack_74 = PVar11.y;
  if ((fVar9 * fVar3 + fVar1 * fVar10 + fVar2 * fVar8) *
      (PVar11.z * fVar3 + local_78 * fVar1 + fStack_74 * fVar2) < 0.0) {
    fVar10 = -fVar10;
    fVar8 = -fVar8;
    fVar9 = -fVar9;
  }
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar1 = b->y;
  (__return_storage_ptr__->a).x = b->x;
  (__return_storage_ptr__->a).y = fVar1;
  uVar4 = (segment->b).x;
  uVar5 = (segment->b).y;
  fVar1 = (segment->b).z;
  (__return_storage_ptr__->b).x = (float)uVar4 + fVar10;
  (__return_storage_ptr__->b).y = (float)uVar5 + fVar8;
  (__return_storage_ptr__->b).z = fVar9 + fVar1;
  return __return_storage_ptr__;
}

Assistant:

Segment randomReflection(Segment const& segment, Triangle const& triangle)
{
  Vector ri = segment.a - segment.b;

  Vector N = triangle.normal;

  float alpha = randFloat(0.0, M_PI*2);
  float u = randFloat(-1.0, 1.0);
  float s = std::sqrt(1.0-u*u);
  Vector v = {static_cast<float>(sin(alpha)*s), static_cast<float>(cos(alpha)*s), u};
  if (dotProduct(ri, N)*dotProduct(v, N)<0)
  {
    v = v*(-1.0);
  }
  return {segment.b, segment.b + v};
}